

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  wchar_t __tmp;
  ulong uVar11;
  int iVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  wchar_t *local_48;
  long local_40;
  ulong local_38;
  
  uVar9 = (ulong)spec->width_;
  uVar7 = f->size_;
  uVar8 = uVar9 - uVar7;
  if (uVar9 < uVar7 || uVar8 == 0) {
    puVar2 = *(undefined8 **)this;
    lVar10 = puVar2[2];
    uVar7 = uVar7 + lVar10;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    local_48 = (wchar_t *)(lVar10 * 4 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,&local_48);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar10 = puVar2[2];
    uVar11 = lVar10 + uVar9;
    if ((ulong)puVar2[3] < uVar11) {
      local_40 = lVar10;
      local_38 = uVar8;
      (**(code **)*puVar2)(puVar2,uVar11);
      uVar8 = local_38;
      lVar10 = local_40;
    }
    puVar2[2] = uVar11;
    auVar6 = _DAT_0023b030;
    auVar5 = _DAT_0023b020;
    auVar4 = _DAT_0023b010;
    lVar3 = puVar2[1];
    local_48 = (wchar_t *)(lVar3 + lVar10 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar11 = uVar8 >> 1;
      if (1 < uVar8) {
        local_48 = local_48 + uVar11;
        uVar8 = uVar11 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar8;
        auVar22._0_8_ = uVar8;
        auVar22._12_4_ = (int)(uVar8 >> 0x20);
        lVar3 = lVar3 + lVar10 * 4;
        lVar10 = 0;
        auVar22 = auVar22 ^ _DAT_0023b030;
        do {
          auVar19._8_4_ = (int)lVar10;
          auVar19._0_8_ = lVar10;
          auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar23 = (auVar19 | auVar5) ^ auVar6;
          iVar17 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar17 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar17 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar10 * 4) = wVar1;
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar10 * 4) = wVar1;
          }
          auVar19 = (auVar19 | auVar4) ^ auVar6;
          iVar24 = auVar19._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar19._0_4_ <= auVar22._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar10 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar10 * 4) = wVar1;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar8 - ((uint)(uVar11 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
      auVar6 = _DAT_0023b030;
      auVar5 = _DAT_0023b020;
      auVar4 = _DAT_0023b010;
      if (uVar9 != uVar7) {
        uVar8 = (uVar9 * 4 + (uVar7 + uVar11) * -4) - 4;
        auVar23._8_4_ = (int)uVar8;
        auVar23._0_8_ = uVar8;
        auVar23._12_4_ = (int)(uVar8 >> 0x20);
        auVar14._0_8_ = uVar8 >> 2;
        auVar14._8_8_ = auVar23._8_8_ >> 2;
        uVar7 = 0;
        auVar14 = auVar14 ^ _DAT_0023b030;
        do {
          auVar20._8_4_ = (int)uVar7;
          auVar20._0_8_ = uVar7;
          auVar20._12_4_ = (int)(uVar7 >> 0x20);
          auVar22 = (auVar20 | auVar5) ^ auVar6;
          iVar17 = auVar14._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar17 && auVar14._0_4_ < auVar22._0_4_ ||
                      iVar17 < auVar22._4_4_) & 1)) {
            local_48[uVar7] = wVar1;
          }
          if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
              auVar22._12_4_ <= auVar14._12_4_) {
            local_48[uVar7 + 1] = wVar1;
          }
          auVar22 = (auVar20 | auVar4) ^ auVar6;
          iVar24 = auVar22._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar14._0_4_)) {
            local_48[uVar7 + 2] = wVar1;
            local_48[uVar7 + 3] = wVar1;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar9 != uVar7) {
        local_48 = local_48 + uVar8;
        uVar8 = (uVar9 * 4 + uVar7 * -4) - 4;
        auVar12._8_4_ = (int)uVar8;
        auVar12._0_8_ = uVar8;
        auVar12._12_4_ = (int)(uVar8 >> 0x20);
        auVar13._0_8_ = uVar8 >> 2;
        auVar13._8_8_ = auVar12._8_8_ >> 2;
        lVar3 = lVar3 + lVar10 * 4;
        uVar7 = 0;
        auVar13 = auVar13 ^ _DAT_0023b030;
        do {
          auVar18._8_4_ = (int)uVar7;
          auVar18._0_8_ = uVar7;
          auVar18._12_4_ = (int)(uVar7 >> 0x20);
          auVar22 = (auVar18 | auVar5) ^ auVar6;
          iVar17 = auVar13._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar17 && auVar13._0_4_ < auVar22._0_4_ ||
                      iVar17 < auVar22._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + uVar7 * 4) = wVar1;
          }
          if ((auVar22._12_4_ != auVar13._12_4_ || auVar22._8_4_ <= auVar13._8_4_) &&
              auVar22._12_4_ <= auVar13._12_4_) {
            *(wchar_t *)(lVar3 + 4 + uVar7 * 4) = wVar1;
          }
          auVar22 = (auVar18 | auVar4) ^ auVar6;
          iVar24 = auVar22._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar13._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + uVar7 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + uVar7 * 4) = wVar1;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
      auVar6 = _DAT_0023b030;
      auVar5 = _DAT_0023b020;
      auVar4 = _DAT_0023b010;
      if (uVar9 != uVar7) {
        uVar8 = (uVar9 * 4 + uVar7 * -4) - 4;
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar16._0_8_ = uVar8 >> 2;
        auVar16._8_8_ = auVar15._8_8_ >> 2;
        uVar7 = 0;
        auVar16 = auVar16 ^ _DAT_0023b030;
        do {
          auVar21._8_4_ = (int)uVar7;
          auVar21._0_8_ = uVar7;
          auVar21._12_4_ = (int)(uVar7 >> 0x20);
          auVar22 = (auVar21 | auVar5) ^ auVar6;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar17 && auVar16._0_4_ < auVar22._0_4_ ||
                      iVar17 < auVar22._4_4_) & 1)) {
            local_48[uVar7] = wVar1;
          }
          if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
              auVar22._12_4_ <= auVar16._12_4_) {
            local_48[uVar7 + 1] = wVar1;
          }
          auVar22 = (auVar21 | auVar4) ^ auVar6;
          iVar24 = auVar22._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar16._0_4_)) {
            local_48[uVar7 + 2] = wVar1;
            local_48[uVar7 + 3] = wVar1;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }